

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_edge_neighbors(REF_GRID ref_grid,REF_INT node,REF_INT *node0,REF_INT *node1)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_INT *pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  int iVar6;
  ulong uVar7;
  REF_INT RVar8;
  long lVar9;
  long lVar10;
  REF_INT *pRVar11;
  bool bVar12;
  
  pRVar2 = ref_grid->cell[0];
  RVar8 = -1;
  *node0 = -1;
  *node1 = -1;
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < pRVar2->ref_adj->nnode) {
      uVar7 = (ulong)(uint)pRVar2->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    RVar8 = pRVar2->ref_adj->item[(int)uVar7].ref;
  }
  do {
    if ((int)uVar7 == -1) {
      return 0;
    }
    if (0 < pRVar2->edge_per) {
      pRVar3 = pRVar2->e2n;
      pRVar4 = pRVar2->c2n;
      lVar9 = 0;
      do {
        lVar10 = (long)pRVar2->size_per * (long)RVar8;
        iVar1 = pRVar4[pRVar3[lVar9 * 2] + lVar10];
        iVar6 = pRVar4[(long)(int)lVar10 + (long)pRVar3[lVar9 * 2 + 1]];
        if ((iVar1 == node) || (bVar12 = iVar6 == node, iVar6 = iVar1, bVar12)) {
          pRVar11 = node0;
          if ((*node0 != -1) && (pRVar11 = node1, *node1 != -1)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x2c7,"ref_smooth_edge_neighbors","found more than two boundary edges");
            return 1;
          }
          *pRVar11 = iVar6;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pRVar2->edge_per);
    }
    pRVar5 = pRVar2->ref_adj->item;
    uVar7 = (ulong)pRVar5[(int)uVar7].next;
    if (uVar7 == 0xffffffffffffffff) {
      RVar8 = -1;
    }
    else {
      RVar8 = pRVar5[uVar7].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_smooth_edge_neighbors(REF_GRID ref_grid, REF_INT node,
                                             REF_INT *node0, REF_INT *node1) {
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item, cell, cell_edge, other;

  *node0 = REF_EMPTY;
  *node1 = REF_EMPTY;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      if (node == ref_cell_e2n(ref_cell, 0, cell_edge, cell)) {
        other = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      } else if (node == ref_cell_e2n(ref_cell, 1, cell_edge, cell)) {
        other = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      } else {
        continue;
      }
      if (REF_EMPTY == *node0) {
        *node0 = other;
        continue;
      }
      if (REF_EMPTY == *node1) {
        *node1 = other;
        continue;
      }
      THROW("found more than two boundary edges");
    }
  }

  return REF_SUCCESS;
}